

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O3

void psh_hint_table_find_strong_points
               (PSH_Hint_Table table,PSH_Point_conflict point,FT_UInt count,FT_Int threshold,
               PSH_Dir major_dir)

{
  long lVar1;
  long lVar2;
  undefined4 in_register_00000014;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  uint in_R9D;
  PSH_Point pPVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  
  iVar6 = (int)table;
  lVar3 = CONCAT44(in_register_00000014,count);
  if (threshold == 0) {
    return;
  }
  lVar2 = (long)(int)major_dir;
  lVar7 = -lVar2;
  uVar4 = (ulong)table & 0xffffffff;
LAB_00238a15:
  uVar5 = *(uint *)(lVar3 + 0x1c);
  if ((uVar5 & 0x10) == 0) {
    lVar1 = *(long *)(lVar3 + 0x30);
    uVar10 = (*(uint *)(lVar3 + 0x24) | *(uint *)(lVar3 + 0x20)) & in_R9D;
    if ((uVar10 & 10) == 0) {
      if ((uVar10 & 5) == 0) {
        if ((uVar5 & 0x40) != 0) {
          if ((uVar5 & (uint)(in_R9D != 0xc) * 0x80 + 0x80) == 0) {
            if (((uint)(in_R9D == 0xc) * 0x80 + 0x80 & uVar5) != 0 && iVar6 != 0) {
              uVar11 = 0;
LAB_00238b37:
              pPVar8 = (&point->prev)[uVar11];
              lVar9 = lVar1 - ((long)*(int *)((long)&pPVar8->prev + 4) + (long)*(int *)&pPVar8->prev
                              );
              if ((lVar9 == lVar7 || SBORROW8(lVar9,lVar7) != lVar9 + lVar2 < 0) || lVar2 <= lVar9)
              goto code_r0x00238b62;
              uVar10 = 0x410;
LAB_00238b7a:
              *(PSH_Point *)(lVar3 + 0x28) = pPVar8;
              *(uint *)(lVar3 + 0x1c) = uVar5 | uVar10;
            }
          }
          else {
            if (iVar6 == 0) goto LAB_00238b10;
            uVar11 = 0;
            do {
              pPVar8 = (&point->prev)[uVar11];
              lVar9 = lVar1 - *(int *)&pPVar8->prev;
              if (lVar9 < lVar2 && (lVar9 != lVar7 && SBORROW8(lVar9,lVar7) == lVar9 + lVar2 < 0)) {
                uVar10 = 0x210;
                goto LAB_00238b7a;
              }
              uVar11 = uVar11 + 1;
            } while (uVar4 != uVar11);
          }
LAB_00238b84:
          if (*(long *)(lVar3 + 0x28) == 0 && iVar6 != 0) {
            uVar11 = 0;
            do {
              pPVar8 = (&point->prev)[uVar11];
              if ((*(int *)&pPVar8->prev <= lVar1) &&
                 (lVar1 <= *(int *)&pPVar8->prev + *(int *)((long)&pPVar8->prev + 4)))
              goto LAB_00238b0c;
              uVar11 = uVar11 + 1;
            } while (uVar4 != uVar11);
          }
        }
      }
      else if (iVar6 != 0) {
        uVar11 = 0;
LAB_00238a85:
        pPVar8 = (&point->prev)[uVar11];
        lVar9 = lVar1 - ((long)*(int *)((long)&pPVar8->prev + 4) + (long)*(int *)&pPVar8->prev);
        if ((lVar9 == lVar7 || SBORROW8(lVar9,lVar7) != lVar9 + lVar2 < 0) || lVar2 <= lVar9)
        goto code_r0x00238ab2;
        uVar5 = uVar5 | 0x410;
LAB_00238b09:
        *(uint *)(lVar3 + 0x1c) = uVar5;
        goto LAB_00238b0c;
      }
    }
    else if (iVar6 != 0) {
      uVar11 = 0;
      do {
        pPVar8 = (&point->prev)[uVar11];
        lVar9 = lVar1 - *(int *)&pPVar8->prev;
        if ((lVar9 != lVar7 && SBORROW8(lVar9,lVar7) == lVar9 + lVar2 < 0) && lVar9 < lVar2) {
          uVar5 = uVar5 | 0x210;
          goto LAB_00238b09;
        }
        uVar11 = uVar11 + 1;
      } while (uVar4 != uVar11);
    }
  }
  goto LAB_00238b10;
code_r0x00238ab2:
  uVar11 = uVar11 + 1;
  if (uVar4 == uVar11) goto LAB_00238b10;
  goto LAB_00238a85;
code_r0x00238b62:
  uVar11 = uVar11 + 1;
  if (uVar4 == uVar11) goto LAB_00238b84;
  goto LAB_00238b37;
LAB_00238b0c:
  *(PSH_Point *)(lVar3 + 0x28) = pPVar8;
LAB_00238b10:
  lVar3 = lVar3 + 0x48;
  threshold = threshold + -1;
  if (threshold == 0) {
    return;
  }
  goto LAB_00238a15;
}

Assistant:

static void
  psh_hint_table_find_strong_points( PSH_Hint_Table  table,
                                     PSH_Point       point,
                                     FT_UInt         count,
                                     FT_Int          threshold,
                                     PSH_Dir         major_dir )
  {
    PSH_Hint*  sort      = table->sort;
    FT_UInt    num_hints = table->num_hints;


    for ( ; count > 0; count--, point++ )
    {
      PSH_Dir  point_dir;
      FT_Pos   org_u = point->org_u;


      if ( psh_point_is_strong( point ) )
        continue;

      point_dir =
        (PSH_Dir)( ( point->dir_in | point->dir_out ) & major_dir );

      if ( point_dir & ( PSH_DIR_DOWN | PSH_DIR_RIGHT ) )
      {
        FT_UInt  nn;


        for ( nn = 0; nn < num_hints; nn++ )
        {
          PSH_Hint  hint = sort[nn];
          FT_Pos    d    = org_u - hint->org_pos;


          if ( d < threshold && -d < threshold )
          {
            psh_point_set_strong( point );
            point->flags2 |= PSH_POINT_EDGE_MIN;
            point->hint    = hint;
            break;
          }
        }
      }
      else if ( point_dir & ( PSH_DIR_UP | PSH_DIR_LEFT ) )
      {
        FT_UInt  nn;


        for ( nn = 0; nn < num_hints; nn++ )
        {
          PSH_Hint  hint = sort[nn];
          FT_Pos    d    = org_u - hint->org_pos - hint->org_len;


          if ( d < threshold && -d < threshold )
          {
            psh_point_set_strong( point );
            point->flags2 |= PSH_POINT_EDGE_MAX;
            point->hint    = hint;
            break;
          }
        }
      }

#if 1
      else if ( psh_point_is_extremum( point ) )
      {
        /* treat extrema as special cases for stem edge alignment */
        FT_UInt  nn, min_flag, max_flag;


        if ( major_dir == PSH_DIR_HORIZONTAL )
        {
          min_flag = PSH_POINT_POSITIVE;
          max_flag = PSH_POINT_NEGATIVE;
        }
        else
        {
          min_flag = PSH_POINT_NEGATIVE;
          max_flag = PSH_POINT_POSITIVE;
        }

        if ( point->flags2 & min_flag )
        {
          for ( nn = 0; nn < num_hints; nn++ )
          {
            PSH_Hint  hint = sort[nn];
            FT_Pos    d    = org_u - hint->org_pos;


            if ( d < threshold && -d < threshold )
            {
              point->flags2 |= PSH_POINT_EDGE_MIN;
              point->hint    = hint;
              psh_point_set_strong( point );
              break;
            }
          }
        }
        else if ( point->flags2 & max_flag )
        {
          for ( nn = 0; nn < num_hints; nn++ )
          {
            PSH_Hint  hint = sort[nn];
            FT_Pos    d    = org_u - hint->org_pos - hint->org_len;


            if ( d < threshold && -d < threshold )
            {
              point->flags2 |= PSH_POINT_EDGE_MAX;
              point->hint    = hint;
              psh_point_set_strong( point );
              break;
            }
          }
        }

        if ( !point->hint )
        {
          for ( nn = 0; nn < num_hints; nn++ )
          {
            PSH_Hint  hint = sort[nn];


            if ( org_u >=          hint->org_pos                  &&
                 org_u <= ADD_INT( hint->org_pos, hint->org_len ) )
            {
              point->hint = hint;
              break;
            }
          }
        }
      }

#endif /* 1 */
    }
  }